

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcCodeStream::~CTcCodeStream(CTcCodeStream *this)

{
  CTcCodeStream *in_RDI;
  
  ~CTcCodeStream(in_RDI);
  operator_delete(in_RDI,0xf0);
  return;
}

Assistant:

CTcCodeStream::~CTcCodeStream()
{
    size_t i;

    /* release all active labels */
    release_labels();

    /* delete the line records pages */
    for (i = 0 ; i < line_pages_alloc_ ; ++i)
        t3free(line_pages_[i]);

    /* delete the master list of pages */
    t3free(line_pages_);
}